

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_tx_size_vartx(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,TX_SIZE tx_size,int depth,int blk_row,
                        int blk_col,aom_writer *w)

{
  BLOCK_SIZE bsize;
  int iVar1;
  int iVar2;
  FRAME_CONTEXT *pFVar3;
  TXFM_CONTEXT *pTVar4;
  TXFM_CONTEXT *pTVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  byte bVar11;
  byte bVar12;
  byte tx_size_00;
  ulong uVar13;
  TX_SIZE TVar14;
  byte *left_ctx;
  byte *above_ctx;
  int col;
  int iVar15;
  
  pFVar3 = xd->tile_ctx;
  bsize = mbmi->bsize;
  iVar7 = max_block_high(xd,bsize,0);
  iVar8 = max_block_wide(xd,bsize,0);
  if (iVar7 <= blk_row) {
    return;
  }
  if (iVar8 <= blk_col) {
    return;
  }
  above_ctx = xd->above_txfm_context + blk_col;
  left_ctx = xd->left_txfm_context + blk_row;
  tx_size_00 = tx_size;
  if (depth == 2) goto LAB_00188d7e;
  uVar6 = (ulong)tx_size;
  if (tx_size == '\0') {
    lVar9 = 0;
  }
  else {
    bVar11 = block_size_high[bsize];
    if (block_size_high[bsize] < block_size_wide[bsize]) {
      bVar11 = block_size_wide[bsize];
    }
    if (bVar11 == 8) {
      TVar14 = '\x01';
      bVar12 = 0;
LAB_00188bbf:
      uVar13 = (ulong)(byte)(((""[uVar6] != TVar14 & bVar12) + TVar14 * -2) * '\x03' + 0x18);
    }
    else {
      bVar12 = 1;
      if (bVar11 == 0x10) {
        TVar14 = '\x02';
        goto LAB_00188bbf;
      }
      TVar14 = '\x04';
      if ((bVar11 == 0x80) || (bVar11 == 0x40)) goto LAB_00188bbf;
      if (bVar11 == 0x20) {
        TVar14 = '\x03';
        goto LAB_00188bbf;
      }
      uVar13 = 0x3f;
    }
    lVar9 = (ulong)(*left_ctx < *(byte *)((long)tx_size_high + (ulong)((uint)tx_size * 4))) +
            (ulong)(*above_ctx < *(byte *)((long)tx_size_wide + (ulong)((uint)tx_size * 4))) +
            uVar13;
  }
  if (mbmi->inter_tx_size
      [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[bsize] & 0x1f)) +
       ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[bsize] & 0x1f)) <<
       (av1_get_txb_size_index_stride_log2_table[bsize] & 0x1f))] == tx_size) {
    aom_write_symbol(w,0,pFVar3->txfm_partition_cdf[lVar9],2);
    pTVar4 = xd->above_txfm_context;
    pTVar5 = xd->left_txfm_context;
  }
  else {
    tx_size_00 = ""[uVar6];
    iVar7 = tx_size_wide_unit[tx_size_00];
    iVar8 = tx_size_high_unit[tx_size_00];
    aom_write_symbol(w,1,pFVar3->txfm_partition_cdf[lVar9],2);
    if ((99UL >> (uVar6 & 0x3f) & 1) == 0) {
      iVar1 = tx_size_high_unit[uVar6];
      for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + iVar8) {
        iVar2 = tx_size_wide_unit[uVar6];
        for (iVar15 = 0; iVar15 < iVar2; iVar15 = iVar15 + iVar7) {
          write_tx_size_vartx(xd,mbmi,tx_size_00,depth + 1,iVar10 + blk_row,blk_col + iVar15,w);
        }
      }
      return;
    }
    pTVar4 = xd->above_txfm_context;
    pTVar5 = xd->left_txfm_context;
  }
  left_ctx = pTVar5 + blk_row;
  above_ctx = pTVar4 + blk_col;
LAB_00188d7e:
  txfm_partition_update(above_ctx,left_ctx,tx_size_00,tx_size);
  return;
}

Assistant:

static inline void write_tx_size_vartx(MACROBLOCKD *xd,
                                       const MB_MODE_INFO *mbmi,
                                       TX_SIZE tx_size, int depth, int blk_row,
                                       int blk_col, aom_writer *w) {
  FRAME_CONTEXT *const ec_ctx = xd->tile_ctx;
  const int max_blocks_high = max_block_high(xd, mbmi->bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, mbmi->bsize, 0);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (depth == MAX_VARTX_DEPTH) {
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  const int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                         xd->left_txfm_context + blk_row,
                                         mbmi->bsize, tx_size);
  const int txb_size_index =
      av1_get_txb_size_index(mbmi->bsize, blk_row, blk_col);
  const int write_txfm_partition =
      tx_size == mbmi->inter_tx_size[txb_size_index];
  if (write_txfm_partition) {
    aom_write_symbol(w, 0, ec_ctx->txfm_partition_cdf[ctx], 2);

    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    // TODO(yuec): set correct txfm partition update for qttx
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

    aom_write_symbol(w, 1, ec_ctx->txfm_partition_cdf[ctx], 2);

    if (sub_txs == TX_4X4) {
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, sub_txs, tx_size);
      return;
    }

    assert(bsw > 0 && bsh > 0);
    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        const int offsetc = blk_col + col;
        write_tx_size_vartx(xd, mbmi, sub_txs, depth + 1, offsetr, offsetc, w);
      }
    }
  }
}